

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpResize_Lagrange
              (void *arkode_mem,ARKInterp I,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  ARKodeMem in_RCX;
  long *in_RSI;
  N_Vector *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  ARKodeMem ark_mem;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  N_Vector *v;
  int local_4;
  
  if (in_RDI == (N_Vector *)0x0) {
    local_4 = -0x15;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = 0;
  }
  else {
    if (*(long *)(*in_RSI + 8) != 0) {
      v = in_RDI;
      for (iVar2 = 0; iVar2 < *(int *)(*in_RSI + 4); iVar2 = iVar2 + 1) {
        iVar1 = arkResizeVec(in_RCX,(ARKVecResizeFn)CONCAT44(in_R8D,in_R9D),
                             (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                             (sunindextype)((ulong)in_RDI >> 0x20),(sunindextype)in_RDI,
                             (N_Vector)(*(long *)(*in_RSI + 8) + (long)iVar2 * 8),v);
        if (iVar1 == 0) {
          return -0x14;
        }
      }
    }
    *(undefined4 *)(*in_RSI + 0x18) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkInterpResize_Lagrange(void* arkode_mem, ARKInterp I,
                             ARKVecResizeFn resize, void *resize_data,
                             sunindextype lrw_diff, sunindextype liw_diff,
                             N_Vector y0)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* resize vectors */
  if (I == NULL)  return(ARK_SUCCESS);
  if (LINT_YHIST(I) != NULL) {
    for (i=0; i<LINT_NMAXALLOC(I); i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &(LINT_YJ(I,i))))
        return(ARK_MEM_FAIL);
    }
  }

  /* reset active history length */
  LINT_NHIST(I) = 0;

  return(ARK_SUCCESS);
}